

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_linear_resampler_init_preallocated
                    (ma_linear_resampler_config *pConfig,void *pHeap,ma_linear_resampler *pResampler
                    )

{
  double dVar1;
  undefined4 uVar2;
  ma_format mVar3;
  ma_uint32 mVar4;
  ma_uint32 mVar5;
  ma_uint32 mVar6;
  ma_result mVar7;
  ma_linear_resampler_heap_layout heapLayout;
  ma_linear_resampler_heap_layout local_40;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    mVar7 = MA_INVALID_ARGS;
  }
  else {
    memset(pResampler,0,0x88);
    mVar7 = ma_linear_resampler_get_heap_layout(pConfig,&local_40);
    if (mVar7 == MA_SUCCESS) {
      mVar3 = pConfig->format;
      mVar4 = pConfig->channels;
      mVar5 = pConfig->sampleRateIn;
      mVar6 = pConfig->sampleRateOut;
      uVar2 = *(undefined4 *)&pConfig->field_0x14;
      dVar1 = pConfig->lpfNyquistFactor;
      (pResampler->config).lpfOrder = pConfig->lpfOrder;
      *(undefined4 *)&(pResampler->config).field_0x14 = uVar2;
      (pResampler->config).lpfNyquistFactor = dVar1;
      (pResampler->config).format = mVar3;
      (pResampler->config).channels = mVar4;
      (pResampler->config).sampleRateIn = mVar5;
      (pResampler->config).sampleRateOut = mVar6;
      pResampler->_pHeap = pHeap;
      if (local_40.sizeInBytes != 0) {
        memset(pHeap,0,local_40.sizeInBytes);
      }
      (pResampler->x0).f32 = (float *)(local_40.x0Offset + (long)pHeap);
      (pResampler->x1).f32 = (float *)(local_40.x1Offset + (long)pHeap);
      mVar7 = ma_linear_resampler_set_rate_internal
                        (pResampler,pHeap,&local_40,pConfig->sampleRateIn,pConfig->sampleRateOut,0);
      if (mVar7 == MA_SUCCESS) {
        pResampler->inTimeInt = 1;
        pResampler->inTimeFrac = 0;
        mVar7 = MA_SUCCESS;
      }
    }
  }
  return mVar7;
}

Assistant:

MA_API ma_result ma_linear_resampler_init_preallocated(const ma_linear_resampler_config* pConfig, void* pHeap, ma_linear_resampler* pResampler)
{
    ma_result result;
    ma_linear_resampler_heap_layout heapLayout;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    result = ma_linear_resampler_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->config = *pConfig;

    pResampler->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    if (pConfig->format == ma_format_f32) {
        pResampler->x0.f32 = (float*)ma_offset_ptr(pHeap, heapLayout.x0Offset);
        pResampler->x1.f32 = (float*)ma_offset_ptr(pHeap, heapLayout.x1Offset);
    } else {
        pResampler->x0.s16 = (ma_int16*)ma_offset_ptr(pHeap, heapLayout.x0Offset);
        pResampler->x1.s16 = (ma_int16*)ma_offset_ptr(pHeap, heapLayout.x1Offset);
    }

    /* Setting the rate will set up the filter and time advances for us. */
    result = ma_linear_resampler_set_rate_internal(pResampler, pHeap, &heapLayout, pConfig->sampleRateIn, pConfig->sampleRateOut, /* isResamplerAlreadyInitialized = */ MA_FALSE);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->inTimeInt  = 1;  /* Set this to one to force an input sample to always be loaded for the first output frame. */
    pResampler->inTimeFrac = 0;

    return MA_SUCCESS;
}